

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O0

bool __thiscall TasgridWrapper::checkSanePostRead(TasgridWrapper *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  bool local_183;
  bool local_182;
  bool local_181;
  bool local_175;
  bool local_174;
  bool local_173;
  bool local_172;
  bool local_171;
  bool local_161;
  bool local_149;
  bool local_139;
  bool local_11a;
  vector<TypeCommand,_std::allocator<TypeCommand>_> local_118;
  array<TypeCommand,_1UL> local_100;
  bool local_fa;
  byte local_f9;
  undefined1 auStack_f8 [6];
  bool is_refine;
  pointer pTStack_f0;
  pointer local_e8;
  array<TypeCommand,_1UL> local_e0;
  byte local_d9;
  vector<TypeCommand,_std::allocator<TypeCommand>_> local_d8;
  array<TypeCommand,_1UL> local_c0;
  byte local_b9;
  vector<TypeCommand,_std::allocator<TypeCommand>_> local_b8;
  array<TypeCommand,_9UL> local_98;
  byte local_59;
  vector<TypeCommand,_std::allocator<TypeCommand>_> local_58;
  array<TypeCommand,_8UL> local_38;
  test_result_wrapper local_15;
  command_tester local_14;
  test_result_wrapper test;
  TasgridWrapper *pTStack_10;
  command_tester com;
  TasgridWrapper *this_local;
  
  local_14.command = this->command;
  pTStack_10 = this;
  test_result_wrapper::test_result_wrapper(&local_15);
  iVar3 = TasGrid::TasmanianSparseGrid::getNumLoaded(&this->grid);
  local_59 = 0;
  local_11a = false;
  if (iVar3 == 0) {
    local_38._M_elems[4] = command_getcoefficients;
    local_38._M_elems[5] = command_refine;
    local_38._M_elems[6] = command_refine_aniso;
    local_38._M_elems[7] = command_refine_surp;
    local_38._M_elems[0] = command_evaluate;
    local_38._M_elems[1] = command_differentiate;
    local_38._M_elems[2] = command_integrate;
    local_38._M_elems[3] = command_getanisocoeff;
    local_58.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<TypeCommand,_std::allocator<TypeCommand>_>::vector(&local_58);
    local_59 = 1;
    local_11a = command_tester::inside<8ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>
                          (&local_14,&local_38,&local_58);
  }
  test_result_wrapper::fail_if(&local_15,local_11a,"the grid has no loaded data");
  if ((local_59 & 1) != 0) {
    std::vector<TypeCommand,_std::allocator<TypeCommand>_>::~vector(&local_58);
  }
  iVar3 = TasGrid::TasmanianSparseGrid::getNumOutputs(&this->grid);
  local_b9 = 0;
  local_139 = false;
  if (iVar3 == 0) {
    local_98._M_elems[4] = command_getcoefficients;
    local_98._M_elems[5] = command_refine;
    local_98._M_elems[6] = command_refine_aniso;
    local_98._M_elems[7] = command_refine_surp;
    local_98._M_elems[0] = command_evaluate;
    local_98._M_elems[1] = command_differentiate;
    local_98._M_elems[2] = command_integrate;
    local_98._M_elems[3] = command_getanisocoeff;
    local_98._M_elems[8] = command_get_candidate_construction;
    local_b8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<TypeCommand,_std::allocator<TypeCommand>_>::vector(&local_b8);
    local_b9 = 1;
    local_139 = command_tester::inside<9ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>
                          (&local_14,&local_98,&local_b8);
  }
  test_result_wrapper::fail_if(&local_15,local_139,"the grid has no outputs");
  if ((local_b9 & 1) != 0) {
    std::vector<TypeCommand,_std::allocator<TypeCommand>_>::~vector(&local_b8);
  }
  iVar3 = this->ref_output;
  iVar4 = TasGrid::TasmanianSparseGrid::getNumOutputs(&this->grid);
  local_d9 = 0;
  local_149 = false;
  if (iVar4 <= iVar3) {
    local_c0._M_elems[0] = (_Type)command_getanisocoeff;
    local_d8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<TypeCommand,_std::allocator<TypeCommand>_>::vector(&local_d8);
    local_d9 = 1;
    local_149 = command_tester::inside<1ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>
                          (&local_14,&local_c0,&local_d8);
  }
  test_result_wrapper::fail_if
            (&local_15,local_149,
             "-refout outside of the range, note the outputs are indexed from zero");
  if ((local_d9 & 1) != 0) {
    std::vector<TypeCommand,_std::allocator<TypeCommand>_>::~vector(&local_d8);
  }
  local_f9 = 0;
  local_161 = false;
  if (this->ref_output == -1) {
    iVar3 = TasGrid::TasmanianSparseGrid::getNumOutputs(&this->grid);
    local_161 = false;
    if (1 < iVar3) {
      bVar1 = TasGrid::TasmanianSparseGrid::isGlobal(&this->grid);
      local_161 = false;
      if (bVar1) {
        local_e0._M_elems[0] = (_Type)command_getanisocoeff;
        _auStack_f8 = (pointer)0x0;
        pTStack_f0 = (pointer)0x0;
        local_e8 = (pointer)0x0;
        std::vector<TypeCommand,_std::allocator<TypeCommand>_>::vector
                  ((vector<TypeCommand,_std::allocator<TypeCommand>_> *)auStack_f8);
        local_f9 = 1;
        local_161 = command_tester::inside<1ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>
                              (&local_14,&local_e0,
                               (vector<TypeCommand,_std::allocator<TypeCommand>_> *)auStack_f8);
      }
    }
  }
  test_result_wrapper::fail_if
            (&local_15,local_161,"-refout cannot use -1 when working with Global grids");
  if ((local_f9 & 1) != 0) {
    std::vector<TypeCommand,_std::allocator<TypeCommand>_>::~vector
              ((vector<TypeCommand,_std::allocator<TypeCommand>_> *)auStack_f8);
  }
  bVar1 = TasGrid::TasmanianSparseGrid::isLocalPolynomial(&this->grid);
  if (bVar1) {
LAB_0016a3e7:
    local_171 = this->command == command_refine_aniso;
  }
  else {
    bVar1 = TasGrid::TasmanianSparseGrid::isWavelet(&this->grid);
    local_171 = false;
    if (bVar1) goto LAB_0016a3e7;
  }
  test_result_wrapper::fail_if
            (&local_15,local_171,
             "anisotropic operations are available only for Global, Sequence and Fourier grids");
  bVar1 = TasGrid::TasmanianSparseGrid::isFourier(&this->grid);
  local_172 = false;
  if (bVar1) {
    local_172 = this->command == command_refine_surp;
  }
  test_result_wrapper::fail_if
            (&local_15,local_172,"surplus refinement cannot be applied to Fourier grids");
  local_173 = true;
  if (this->command != command_refine) {
    local_173 = this->command == command_get_candidate_construction;
  }
  local_fa = local_173;
  if ((this->command == command_refine_aniso) ||
     ((local_173 != false &&
      (((bVar1 = TasGrid::TasmanianSparseGrid::isGlobal(&this->grid), bVar1 ||
        (bVar1 = TasGrid::TasmanianSparseGrid::isSequence(&this->grid), bVar1)) ||
       (bVar1 = TasGrid::TasmanianSparseGrid::isFourier(&this->grid), bVar1)))))) {
    bVar1 = TasGrid::TasmanianSparseGrid::isLocalPolynomial(&this->grid);
    local_174 = true;
    if (!bVar1) {
      local_174 = TasGrid::TasmanianSparseGrid::isWavelet(&this->grid);
    }
    test_result_wrapper::fail_if
              (&local_15,local_174,
               "anisotropic refinement can be applied only to Global, Sequence and Fourier grids");
    test_result_wrapper::fail_if
              (&local_15,this->depth_type == type_none,
               "anisotropic refinement requires depth type with -tt");
    bVar1 = false;
    local_175 = false;
    if (this->ref_output == -1) {
      iVar3 = TasGrid::TasmanianSparseGrid::getNumOutputs(&this->grid);
      local_175 = false;
      if (1 < iVar3) {
        bVar2 = TasGrid::TasmanianSparseGrid::isGlobal(&this->grid);
        local_175 = false;
        if (bVar2) {
          local_100._M_elems[0] = (_Type)command_getanisocoeff;
          local_118.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_118.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_118.super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<TypeCommand,_std::allocator<TypeCommand>_>::vector(&local_118);
          bVar1 = true;
          local_175 = command_tester::
                      inside<1ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>
                                (&local_14,&local_100,&local_118);
        }
      }
    }
    test_result_wrapper::fail_if
              (&local_15,local_175,"-refout cannot use -1 when working with Global grids");
    if (bVar1) {
      std::vector<TypeCommand,_std::allocator<TypeCommand>_>::~vector(&local_118);
    }
    test_result_wrapper::worry_if
              (&local_15,(bool)(this->set_tolerance & 1),
               "anisotropic refinement (and grids Global, Sequence, Fourier) ignores the -tolerance option"
              );
    test_result_wrapper::worry_if
              (&local_15,(bool)(this->set_tref & 1),
               "anisotropic refinement (and grids Global, Sequence, Fourier) ignores the -reftype option"
              );
  }
  if ((this->command == command_refine_surp) ||
     (((local_fa & 1U) != 0 &&
      ((bVar1 = TasGrid::TasmanianSparseGrid::isLocalPolynomial(&this->grid), bVar1 ||
       (bVar1 = TasGrid::TasmanianSparseGrid::isWavelet(&this->grid), bVar1)))))) {
    test_result_wrapper::fail_if
              (&local_15,(bool)((this->set_tolerance ^ 0xffU) & 1),
               "must specify -tolerance for surplus refinement");
    test_result_wrapper::fail_if
              (&local_15,(bool)((this->set_tref ^ 0xffU) & 1),"must specify -reftype option");
    uVar5 = std::__cxx11::string::empty();
    local_181 = false;
    if ((uVar5 & 1) == 0) {
      bVar1 = TasGrid::TasmanianSparseGrid::isGlobal(&this->grid);
      local_182 = true;
      if (!bVar1) {
        bVar1 = TasGrid::TasmanianSparseGrid::isSequence(&this->grid);
        local_182 = true;
        if (!bVar1) {
          local_182 = TasGrid::TasmanianSparseGrid::isFourier(&this->grid);
        }
      }
      local_181 = local_182;
    }
    test_result_wrapper::worry_if
              (&local_15,local_181,
               "the scale factors are not used with Global, Sequence and Fourier grids");
  }
  bVar1 = TasGrid::TasmanianSparseGrid::isLocalPolynomial(&this->grid);
  if (!bVar1) {
    bVar1 = TasGrid::TasmanianSparseGrid::isWavelet(&this->grid);
    local_183 = false;
    if (!bVar1) goto LAB_0016a8d3;
  }
  local_183 = this->command == command_getpoly;
LAB_0016a8d3:
  test_result_wrapper::fail_if
            (&local_15,local_183,
             "cannot call -getpoly for a grid that is neither Global nor Sequence");
  bVar1 = test_result_wrapper::operator_cast_to_bool(&local_15);
  return bVar1;
}

Assistant:

bool TasgridWrapper::checkSanePostRead() const{
    command_tester com{command};
    test_result_wrapper test;

    test.fail_if(grid.getNumLoaded() == 0 and
                 com.inside(CArr<8>{command_evaluate, command_differentiate, command_integrate, command_getanisocoeff,
                             command_getcoefficients, command_refine, command_refine_aniso, command_refine_surp}),
                 "the grid has no loaded data");
    test.fail_if(grid.getNumOutputs() == 0 and
                 com.inside(CArr<9>{command_evaluate, command_differentiate, command_integrate, command_getanisocoeff,
                             command_getcoefficients, command_refine, command_refine_aniso, command_refine_surp,
                             command_get_candidate_construction}),
                 "the grid has no outputs");

    test.fail_if(ref_output >= grid.getNumOutputs() and
                 com.inside(CArr<1>{command_getanisocoeff, }),
                 "-refout outside of the range, note the outputs are indexed from zero");
    test.fail_if(ref_output == -1 and grid.getNumOutputs() > 1 and grid.isGlobal() and
                 com.inside(CArr<1>{command_getanisocoeff}),
                 "-refout cannot use -1 when working with Global grids");

    test.fail_if((grid.isLocalPolynomial() or grid.isWavelet()) and command == command_refine_aniso,
                 "anisotropic operations are available only for Global, Sequence and Fourier grids");
    test.fail_if((grid.isFourier() and command == command_refine_surp),
                 "surplus refinement cannot be applied to Fourier grids");

    bool is_refine = (command == command_refine or command == command_get_candidate_construction);
    if (command == command_refine_aniso or (is_refine and (grid.isGlobal() or grid.isSequence() or grid.isFourier()))){
        test.fail_if(grid.isLocalPolynomial() or grid.isWavelet(),
                     "anisotropic refinement can be applied only to Global, Sequence and Fourier grids");
        test.fail_if(depth_type == type_none, "anisotropic refinement requires depth type with -tt");
        test.fail_if(ref_output == -1 and grid.getNumOutputs() > 1 and grid.isGlobal() and
                     com.inside(CArr<1>{command_getanisocoeff}),
                     "-refout cannot use -1 when working with Global grids");

        test.worry_if(set_tolerance, "anisotropic refinement (and grids Global, Sequence, Fourier) ignores the -tolerance option");
        test.worry_if(set_tref, "anisotropic refinement (and grids Global, Sequence, Fourier) ignores the -reftype option");
    }

    if (command == command_refine_surp or (is_refine and (grid.isLocalPolynomial() or grid.isWavelet()))){
        test.fail_if(not set_tolerance, "must specify -tolerance for surplus refinement");
        test.fail_if(not set_tref, "must specify -reftype option");

        test.worry_if(not valsfilename.empty() and (grid.isGlobal() or grid.isSequence() or grid.isFourier()),
                      "the scale factors are not used with Global, Sequence and Fourier grids");
    }

    test.fail_if((grid.isLocalPolynomial() or grid.isWavelet()) and command == command_getpoly,
                 "cannot call -getpoly for a grid that is neither Global nor Sequence");

    return test;
}